

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O0

string * setup::filename_map::shorten_path(string *path)

{
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  this;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  slice_reader *psVar2;
  ulong uVar3;
  string *in_RDI;
  size_t last_sep;
  size_t segment_length;
  it s_end;
  it s_begin;
  it end;
  it begin;
  string *result;
  __normal_iterator<const_setup::language_entry_*,_std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>_>
  *in_stack_ffffffffffffff48;
  uint7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff88;
  char *local_68;
  char *local_40;
  char *local_38;
  char *local_30;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)in_RDI);
  local_30 = (char *)std::__cxx11::string::begin();
  local_38 = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    local_40 = local_30;
    this = std::
           find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,setup::(anonymous_namespace)::is_path_separator>
                     (local_30,local_38);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_setup::language_entry_*,_std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48);
    if (bVar1) {
      local_68 = local_38;
    }
    else {
      local_68 = (char *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(this._M_current,
                                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    }
    local_30 = local_68;
    __first._M_current =
         (char *)__gnu_cxx::operator-
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_ffffffffffffff48);
    if ((__first._M_current != (char *)0x0) &&
       ((__first._M_current != (char *)0x1 ||
        (psVar2 = boost::unordered::detail::
                  table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                  ::next_node((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                               *)&local_40), (char)psVar2->data_offset != '.')))) {
      in_stack_ffffffffffffff57 = false;
      if (__first._M_current == (char *)0x2) {
        psVar2 = boost::unordered::detail::
                 table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                 ::next_node((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                              *)&local_40);
        in_stack_ffffffffffffff57 = false;
        if ((char)psVar2->data_offset == '.') {
          in_stack_ffffffffffffff88 =
               __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(this._M_current,(ulong)in_stack_ffffffffffffff50);
          psVar2 = boost::unordered::detail::
                   table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                   ::next_node((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                                *)&stack0xffffffffffffff88);
          in_stack_ffffffffffffff57 = (char)psVar2->data_offset == '.';
        }
      }
      if ((bool)in_stack_ffffffffffffff57 == false) {
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          std::__cxx11::string::push_back((char)in_RDI);
        }
        std::__cxx11::string::
        append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  (in_stack_ffffffffffffff80,__first,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )in_stack_ffffffffffffff88._M_current);
      }
      else {
        in_stack_ffffffffffffff80 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::find_last_of((char)in_RDI,0x2f);
        if (in_stack_ffffffffffffff80 ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff)
        {
          in_stack_ffffffffffffff80 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        std::__cxx11::string::resize((ulong)in_RDI);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::string filename_map::shorten_path(const std::string & path) {
	
	std::string result;
	result.reserve(path.size());
	
	it begin = path.begin();
	it end = path.end();
	while(begin != end) {
		
		it s_begin = begin;
		it s_end = std::find_if(begin, end, is_path_separator());
		begin = (s_end == end) ? end : (s_end + 1);
		
		size_t segment_length = size_t(s_end - s_begin);
		
		// Empty segment - ignore
		if(segment_length == 0) {
			continue;
		}
		
		// '.' segment - ignore
		if(segment_length == 1 && *s_begin == '.') {
			continue;
		}
		
		// '..' segment - backtrace in result path
		if(segment_length == 2 && *s_begin == '.' && *(s_begin + 1) == '.') {
			size_t last_sep = result.find_last_of(path_sep);
			if(last_sep == std::string::npos) {
				last_sep = 0;
			}
			result.resize(last_sep);
			continue;
		}
		
		// Normal segment - append to the result path
		if(!result.empty()) {
			result.push_back(path_sep);
		}
		result.append(s_begin, s_end);
		
	}
	
	return result;
}